

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O0

void __thiscall
mocker::ir::Call::Call<std::shared_ptr<mocker::ir::Addr>>
          (Call *this,shared_ptr<mocker::ir::Reg> *dest,string *funcName,
          shared_ptr<mocker::ir::Addr> *args)

{
  initializer_list<std::shared_ptr<mocker::ir::Addr>_> __l;
  shared_ptr<mocker::ir::Addr> *local_c8;
  allocator<std::shared_ptr<mocker::ir::Addr>_> local_69;
  shared_ptr<mocker::ir::Addr> local_68;
  shared_ptr<mocker::ir::Addr> local_58 [2];
  shared_ptr<mocker::ir::Reg> local_38;
  shared_ptr<mocker::ir::Addr> *local_28;
  shared_ptr<mocker::ir::Addr> *args_local;
  string *funcName_local;
  shared_ptr<mocker::ir::Reg> *dest_local;
  Call *this_local;
  
  local_28 = args;
  args_local = (shared_ptr<mocker::ir::Addr> *)funcName;
  funcName_local = (string *)dest;
  dest_local = (shared_ptr<mocker::ir::Reg> *)this;
  IRInst::IRInst(&this->super_IRInst,Call);
  std::shared_ptr<mocker::ir::Reg>::shared_ptr(&local_38,dest);
  Definition::Definition(&this->super_Definition,&local_38);
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr(&local_38);
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Call_0039b2b0;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Call_0039b2d0;
  std::__cxx11::string::string((string *)&this->funcName,(string *)funcName);
  std::shared_ptr<mocker::ir::Addr>::shared_ptr(&local_68,args);
  local_58[0].super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_58[0].super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_68;
  std::allocator<std::shared_ptr<mocker::ir::Addr>_>::allocator(&local_69);
  __l._M_len = (size_type)
               local_58[0].super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_58[0].super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
  vector(&this->args,__l,&local_69);
  std::allocator<std::shared_ptr<mocker::ir::Addr>_>::~allocator(&local_69);
  local_c8 = local_58;
  do {
    local_c8 = local_c8 + -1;
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr(local_c8);
  } while (local_c8 != &local_68);
  return;
}

Assistant:

Call(std::shared_ptr<Reg> dest, std::string funcName, Args... args)
      : IRInst(InstType::Call), Definition(std::move(dest)),
        funcName(std::move(funcName)), args({std::move(args)...}) {}